

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O1

bool __thiscall
cmMacroHelperCommand::InvokeInitialPass
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMacroHelperCommand *pcVar3;
  pointer pcVar4;
  bool bVar5;
  byte bVar6;
  pointer pbVar7;
  long *plVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  cmExecutionStatus *pcVar11;
  ulong uVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer pcVar15;
  pointer pcVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmExecutionStatus status;
  cmListFileFunction newLFF;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  MacroPushPop macroScope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  string expandedArgv;
  string expandedArgn;
  string argcDef;
  char argvName [60];
  ostringstream argcDefStream;
  byte local_389;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  string local_370;
  cmMacroHelperCommand *local_350;
  pointer local_348;
  cmListFileArgument local_340;
  cmExecutionStatus *local_310;
  undefined1 local_308 [32];
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  long local_2c8;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> vStack_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  cmExecutionStatus *local_290;
  cmExecutionStatus *local_288;
  pointer local_280;
  MacroPushPop local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_388.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310 = inStatus;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&local_388,(char *)0x0);
  if ((ulong)((long)local_388.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_388.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Macro invoked with incorrect arguments for macro named: ","");
    std::__cxx11::string::_M_append
              ((char *)local_1a8,
               (ulong)(((this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    cmCommand::SetError(&this->super_cmCommand,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    bVar6 = 0;
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              (&local_278,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    local_308._0_8_ =
         (long)local_388.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
         (long)(this->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
         (-0x20 - (long)(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    local_308._8_8_ =
         local_388.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_228,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_308,";");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_248,&local_388,";");
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_2a8,
              ((long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
    pbVar7 = (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_350 = this;
    if (0x20 < (ulong)((long)(this->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7)) {
      uVar12 = 1;
      uVar13 = 2;
      do {
        std::operator+(local_1e8,"${",pbVar7 + uVar12);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_1e8);
        local_308._0_8_ = local_308 + 0x10;
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 2);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8 == pbVar10)
        {
          local_308._16_8_ = (pbVar10->_M_dataplus)._M_p;
          local_308._24_8_ = plVar8[3];
        }
        else {
          local_308._16_8_ = (pbVar10->_M_dataplus)._M_p;
          local_308._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
        }
        local_308._8_8_ = plVar8[1];
        *plVar8 = (long)pbVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_308 + 0x10))
        {
          operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8[0]._M_dataplus._M_p != &local_1e8[0].field_2) {
          operator_delete(local_1e8[0]._M_dataplus._M_p,
                          local_1e8[0].field_2._M_allocated_capacity + 1);
        }
        pbVar7 = (local_350->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar5 = uVar13 < (ulong)((long)(local_350->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >>
                                5);
        uVar12 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (bVar5);
    }
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_268,
              (long)local_388.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_388.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
    pcVar3 = local_350;
    if (local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = 0;
      do {
        sprintf((char *)local_1e8,"${ARGV%u}",uVar12);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[60]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                   (char (*) [60])local_1e8);
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (uVar12 < (ulong)((long)local_388.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_388.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_2e8._M_p = (pointer)&local_2d8;
    local_308._0_8_ = local_308 + 0x10;
    local_308._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_308._16_8_ = local_308._16_8_ & 0xffffffffffffff00;
    local_2e0 = 0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8 = 0;
    vStack_2c0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_2c0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_2c0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348 = (pcVar3->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_280 = (pcVar3->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish;
    bVar6 = 1;
    if (local_348 != local_280) {
      paVar1 = &local_370.field_2;
      local_290 = (cmExecutionStatus *)&local_310->BreakInvoked;
      local_288 = (cmExecutionStatus *)&local_310->NestedError;
      do {
        pcVar2 = vStack_2c0.
                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        pcVar16 = vStack_2c0.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (vStack_2c0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            vStack_2c0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          paVar14 = &((vStack_2c0.
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_start)->Value).field_2;
          do {
            plVar8 = (long *)(((string *)(paVar14 + -1))->_M_dataplus)._M_p;
            if (paVar14 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar8) {
              operator_delete(plVar8,paVar14->_M_allocated_capacity + 1);
            }
            pcVar15 = (pointer)(paVar14 + 2);
            paVar14 = paVar14 + 3;
          } while (pcVar15 != pcVar2);
          vStack_2c0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
          _M_impl.super__Vector_impl_data._M_finish = pcVar16;
        }
        pcVar4 = local_348;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                  (&vStack_2c0,
                   ((long)(local_348->Arguments).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_348->Arguments).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
        std::__cxx11::string::_M_assign((string *)local_308);
        std::__cxx11::string::_M_assign((string *)(local_308 + 0x20));
        local_2c8 = (pcVar4->super_cmCommandContext).Line;
        pcVar2 = (pcVar4->Arguments).
                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pcVar16 = (pcVar4->Arguments).
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_start; pcVar16 != pcVar2;
            pcVar16 = pcVar16 + 1) {
          local_340.Value._M_dataplus._M_p = (pointer)&local_340.Value.field_2;
          local_340.Value._M_string_length = 0;
          local_340.Value.field_2._M_local_buf[0] = '\0';
          local_340.Delim = Unquoted;
          local_340.Line = 0;
          std::__cxx11::string::_M_assign((string *)&local_340);
          if (pcVar16->Delim != Bracket) {
            if (local_2a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_2a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar12 = 0;
              uVar13 = 1;
              do {
                cmsys::SystemTools::ReplaceString
                          (&local_340.Value,
                           local_2a8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12,
                           local_388.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12);
                bVar5 = uVar13 < (ulong)((long)local_2a8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_2a8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar12 = uVar13;
                uVar13 = (ulong)((int)uVar13 + 1);
              } while (bVar5);
            }
            local_370._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"${ARGC}","");
            cmsys::SystemTools::ReplaceString(&local_340.Value,&local_370,&local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != paVar1) {
              operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1
                             );
            }
            local_370._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"${ARGN}","");
            cmsys::SystemTools::ReplaceString(&local_340.Value,&local_370,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != paVar1) {
              operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1
                             );
            }
            local_370._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"${ARGV}","");
            cmsys::SystemTools::ReplaceString(&local_340.Value,&local_370,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != paVar1) {
              operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1
                             );
            }
            lVar9 = std::__cxx11::string::find((char *)&local_340,0x4bb84d,0);
            if ((lVar9 != -1) &&
               (local_388.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_388.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)) {
              uVar12 = 0;
              uVar13 = 1;
              do {
                cmsys::SystemTools::ReplaceString
                          (&local_340.Value,
                           local_268.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12,
                           local_388.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12);
                bVar5 = uVar13 < (ulong)((long)local_388.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_388.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar12 = uVar13;
                uVar13 = (ulong)((int)uVar13 + 1);
              } while (bVar5);
            }
          }
          local_340.Delim = pcVar16->Delim;
          local_340.Line = pcVar16->Line;
          std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
          emplace_back<cmListFileArgument>(&vStack_2c0,&local_340);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340.Value._M_dataplus._M_p != &local_340.Value.field_2) {
            operator_delete(local_340.Value._M_dataplus._M_p,
                            CONCAT71(local_340.Value.field_2._M_allocated_capacity._1_7_,
                                     local_340.Value.field_2._M_local_buf[0]) + 1);
          }
        }
        local_340.Value._M_dataplus._M_p = local_340.Value._M_dataplus._M_p & 0xffffffff00000000;
        bVar5 = cmMakefile::ExecuteCommand
                          ((local_350->super_cmCommand).Makefile,(cmListFileFunction *)local_308,
                           (cmExecutionStatus *)&local_340);
        if ((bVar5) && (local_340.Value._M_dataplus._M_p._3_1_ != '\x01')) {
          bVar6 = 1;
          pcVar11 = local_310;
          if ((char)local_340.Value._M_dataplus._M_p != '\0') goto LAB_00213418;
          bVar6 = 1;
          bVar5 = true;
          pcVar11 = local_290;
          if (local_340.Value._M_dataplus._M_p._1_1_ == '\x01') goto LAB_00213418;
        }
        else {
          local_278.ReportError = false;
          bVar6 = 0;
          pcVar11 = local_288;
LAB_00213418:
          pcVar11->ReturnInvoked = true;
          bVar5 = false;
          local_389 = bVar6;
        }
        bVar6 = local_389;
        if (!bVar5) goto LAB_00213487;
        local_348 = local_348 + 1;
      } while (local_348 != local_280);
      bVar6 = 1;
    }
LAB_00213487:
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&vStack_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_p != &local_2d8) {
      operator_delete(local_2e8._M_p,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_308 + 0x10)) {
      operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    cmMakefile::MacroPushPop::~MacroPushPop(&local_278);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_388);
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmMacroHelperCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus& inStatus)
{
  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1) {
    std::string errorMsg =
      "Macro invoked with incorrect arguments for macro named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
  }

  cmMakefile::MacroPushPop macroScope(this->Makefile, this->FilePath,
                                      this->Policies);

  // set the value of argc
  std::ostringstream argcDefStream;
  argcDefStream << expandedArgs.size();
  std::string argcDef = argcDefStream.str();

  std::vector<std::string>::const_iterator eit =
    expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j) {
    variables.push_back("${" + this->Args[j] + "}");
  }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j) {
    sprintf(argvName, "${ARGV%u}", j);
    argVs.emplace_back(argvName);
  }
  // Invoke all the functions that were collected in the block.
  cmListFileFunction newLFF;
  // for each function
  for (cmListFileFunction const& func : this->Functions) {
    // Replace the formal arguments and then invoke the command.
    newLFF.Arguments.clear();
    newLFF.Arguments.reserve(func.Arguments.size());
    newLFF.Name = func.Name;
    newLFF.Line = func.Line;

    // for each argument of the current function
    for (cmListFileArgument const& k : func.Arguments) {
      cmListFileArgument arg;
      arg.Value = k.Value;
      if (k.Delim != cmListFileArgument::Bracket) {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j) {
          cmSystemTools::ReplaceString(arg.Value, variables[j],
                                       expandedArgs[j]);
        }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}", argcDef);

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}", expandedArgn);
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}", expandedArgv);

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos) {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t) {
            cmSystemTools::ReplaceString(arg.Value, argVs[t], expandedArgs[t]);
          }
        }
      }
      arg.Delim = k.Delim;
      arg.Line = k.Line;
      newLFF.Arguments.push_back(std::move(arg));
    }
    cmExecutionStatus status;
    if (!this->Makefile->ExecuteCommand(newLFF, status) ||
        status.GetNestedError()) {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError();
      return false;
    }
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked();
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
  }
  return true;
}